

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O1

void soul::heart::Checker::testHEARTRoundTrip(Program *program)

{
  int iVar1;
  int in_ECX;
  Program *in_RDX;
  void *__child_stack;
  Program *p;
  void *in_R8;
  Program PVar2;
  string dump;
  undefined1 local_c0 [56];
  SourceCodeText *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  string local_40;
  
  Printer::getDump_abi_cxx11_((string *)(local_c0 + 0x30),(Printer *)program,in_RDX);
  Program::ProgramImpl::clone
            ((ProgramImpl *)local_c0,(__fn *)program->pimpl,__child_stack,in_ECX,in_R8);
  Printer::getDump_abi_cxx11_((string *)(local_c0 + 0x10),(Printer *)local_c0,p);
  if (local_88 != (SourceCodeText *)local_c0._24_8_) {
LAB_001e3fcb:
    throwInternalCompilerError("dump == program.clone().toHEART()","testHEARTRoundTrip",0x1a9);
  }
  if (local_88 != (SourceCodeText *)0x0) {
    iVar1 = bcmp((void *)local_c0._48_8_,(void *)local_c0._16_8_,(size_t)local_88);
    if (iVar1 != 0) goto LAB_001e3fcb;
  }
  if ((pointer)local_c0._16_8_ != (pointer)(local_c0 + 0x20)) {
    operator_delete((void *)local_c0._16_8_,(ulong)(local_c0._32_8_ + 1));
  }
  RefCountedPtr<soul::Program::ProgramImpl>::decIfNotNull((ProgramImpl *)local_c0._8_8_);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"internal test dump","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_c0._48_8_,
             (undefined1 *)
             ((long)&(((__uniq_ptr_data<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>,_true,_true>
                        *)&local_88->super_RefCountedObject)->
                     super___uniq_ptr_impl<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>
                     )._M_t.
                     super__Tuple_impl<0UL,_soul::PoolAllocator::Pool_*,_std::default_delete<soul::PoolAllocator::Pool>_>
             + (long)&(((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                         *)local_c0._48_8_)->
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_t));
  CodeLocation::createFromString((CodeLocation *)&local_70,&local_40,&local_60);
  PVar2 = Parser::parse((Parser *)local_c0,(CodeLocation *)&local_70);
  Printer::getDump_abi_cxx11_
            ((string *)(local_c0 + 0x10),(Printer *)local_c0,
             (Program *)PVar2.refHolder.object.object);
  if (local_88 == (SourceCodeText *)local_c0._24_8_) {
    if (local_88 != (SourceCodeText *)0x0) {
      iVar1 = bcmp((void *)local_c0._48_8_,(void *)local_c0._16_8_,(size_t)local_88);
      if (iVar1 != 0) goto LAB_001e3fe3;
    }
    if ((pointer)local_c0._16_8_ != (pointer)(local_c0 + 0x20)) {
      operator_delete((void *)local_c0._16_8_,(ulong)(local_c0._32_8_ + 1));
    }
    RefCountedPtr<soul::Program::ProgramImpl>::decIfNotNull((ProgramImpl *)local_c0._8_8_);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull
              ((SourceCodeText *)local_70._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._48_8_ != &local_80) {
      operator_delete((void *)local_c0._48_8_,(ulong)(local_80._M_allocated_capacity + 1));
    }
    return;
  }
LAB_001e3fe3:
  throwInternalCompilerError
            ("dump == heart::Parser::parse (CodeLocation::createFromString (\"internal test dump\", dump)).toHEART()"
             ,"testHEARTRoundTrip",0x1aa);
}

Assistant:

static void testHEARTRoundTrip (const Program& program)
    {
        ignoreUnused (program);

       #if SOUL_ENABLE_ASSERTIONS && (SOUL_TEST_HEART_ROUNDTRIP || (SOUL_DEBUG && ! defined (SOUL_TEST_HEART_ROUNDTRIP)))
        auto dump = program.toHEART();
        SOUL_ASSERT (dump == program.clone().toHEART());
        SOUL_ASSERT (dump == heart::Parser::parse (CodeLocation::createFromString ("internal test dump", dump)).toHEART());
       #endif
    }